

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

ClientProperties * __thiscall
duckdb::ClientContext::GetClientProperties
          (ClientProperties *__return_storage_ptr__,ClientContext *this)

{
  shared_ptr<duckdb::DatabaseInstance,_true> *this_00;
  ArrowOffsetSize arrow_offset_size_p;
  bool arrow_use_list_view_p;
  bool produce_arrow_string_view_p;
  SettingLookupResult SVar1;
  DatabaseInstance *pDVar2;
  allocator local_e9;
  string local_e8;
  LogicalType local_c8;
  string timezone;
  string local_90;
  Value result;
  
  ::std::__cxx11::string::string((string *)&timezone,"UTC",(allocator *)&result);
  LogicalType::LogicalType(&local_c8,SQLNULL);
  Value::Value(&result,&local_c8);
  LogicalType::~LogicalType(&local_c8);
  ::std::__cxx11::string::string((string *)&local_e8,"TimeZone",&local_e9);
  SVar1 = TryGetCurrentSetting(this,&local_e8,&result);
  ::std::__cxx11::string::~string((string *)&local_e8);
  if (SVar1.scope != INVALID) {
    Value::ToString_abi_cxx11_(&local_e8,&result);
    ::std::__cxx11::string::operator=((string *)&timezone,(string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  ::std::__cxx11::string::string((string *)&local_90,(string *)&timezone);
  this_00 = &this->db;
  pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  arrow_offset_size_p = (pDVar2->config).options.arrow_offset_size;
  pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  arrow_use_list_view_p = (pDVar2->config).options.arrow_use_list_view;
  pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  produce_arrow_string_view_p = (pDVar2->config).options.produce_arrow_string_views;
  pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
  ClientProperties::ClientProperties
            (__return_storage_ptr__,&local_90,arrow_offset_size_p,arrow_use_list_view_p,
             produce_arrow_string_view_p,(pDVar2->config).options.arrow_lossless_conversion,
             (optional_ptr<duckdb::ClientContext,_true>)this);
  ::std::__cxx11::string::~string((string *)&local_90);
  Value::~Value(&result);
  ::std::__cxx11::string::~string((string *)&timezone);
  return __return_storage_ptr__;
}

Assistant:

ClientProperties ClientContext::GetClientProperties() {
	string timezone = "UTC";
	Value result;

	if (TryGetCurrentSetting("TimeZone", result)) {
		timezone = result.ToString();
	}
	return {timezone,
	        db->config.options.arrow_offset_size,
	        db->config.options.arrow_use_list_view,
	        db->config.options.produce_arrow_string_views,
	        db->config.options.arrow_lossless_conversion,
	        this};
}